

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O0

string * utilities::rtrim(string *s)

{
  string *in_RSI;
  string *in_RDI;
  size_t end;
  allocator local_19;
  long local_18;
  string *local_10;
  
  local_10 = in_RSI;
  local_18 = std::__cxx11::string::find_last_not_of(in_RSI,0x15a5d8);
  if (local_18 == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"",&local_19);
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
  }
  else {
    std::__cxx11::string::substr((ulong)in_RDI,(ulong)local_10);
  }
  return in_RDI;
}

Assistant:

std::string rtrim(const std::string& s)
    {
        size_t end = s.find_last_not_of(WHITESPACE);
        return (end == std::string::npos) ? "" : s.substr(0, end + 1);
    }